

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Events.c
# Opt level: O1

void hero_sleeps(tgestate_t *state)

{
  set_roomdef(state,'\x02',0x1a,0x17);
  hero_sit_sleep_common(state,&state->hero_in_bed);
  return;
}

Assistant:

void hero_sleeps(tgestate_t *state)
{
  assert(state != NULL);

  set_roomdef(state,
              room_2_HUT2LEFT,
              roomdef_2_BED,
              interiorobject_OCCUPIED_BED);
  hero_sit_sleep_common(state, &state->hero_in_bed);
}